

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRows(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Item *pIVar15;
  pointer pnVar16;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar17;
  undefined4 *puVar18;
  soplex *psVar19;
  uint *puVar20;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar21;
  long lVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  int iVar24;
  int iVar25;
  long in_FS_OFFSET;
  byte bVar26;
  DataArray<int> newCols;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  DataArray<int> local_420;
  DataArray<int> *local_408;
  DataKey local_400;
  undefined4 local_3f8;
  uint uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  double local_3e8;
  undefined8 uStack_3e0;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar26 = 0;
  iVar1 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_420.data = (int *)0x0;
  local_420.memFactor = 1.2;
  local_420.thesize = 0;
  if (0 < iVar1) {
    local_420.thesize = iVar1;
  }
  local_420.themax = 1;
  if (0 < iVar1) {
    local_420.themax = local_420.thesize;
  }
  spx_alloc<int*>(&local_420.data,local_420.themax);
  iVar1 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar2 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  if ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)set != this) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
  }
  iVar25 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  lVar11 = (long)iVar25;
  if (0 < lVar11) {
    memset(local_420.data + ((lVar11 + -1) - (ulong)(iVar25 - 1)),0,lVar11 * 4);
  }
  lVar11 = (long)(set->
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).set.thenum;
  if (0 < lVar11) {
    do {
      pIVar15 = (set->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).set.theitem;
      iVar25 = (set->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thekey[lVar11 + -1].idx;
      lVar14 = (long)pIVar15[iVar25].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar14) {
        do {
          iVar3 = pIVar15[iVar25].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem[lVar14 + -1].idx;
          if ((this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar3) {
            LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::LPColBase(&local_3d8,0);
            DataArray<int>::reSize(&local_420,iVar3 + 1);
            iVar24 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            lVar22 = (long)iVar24;
            if (iVar24 <= iVar3) {
              iVar24 = (iVar3 - iVar24) + 1;
              do {
                local_420.data[lVar22] = 0;
                local_400.info = 0;
                local_400.idx = -1;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(&this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&local_400,&local_3d8);
                lVar22 = lVar22 + 1;
                iVar24 = iVar24 + -1;
              } while (iVar24 != 0);
            }
            local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
            if (local_3d8.vec.theelem !=
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
              free(local_3d8.vec.theelem);
              local_3d8.vec.theelem =
                   (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
            }
          }
          local_420.data[iVar3] = local_420.data[iVar3] + 1;
          bVar9 = 1 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar9);
      }
      bVar9 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar9);
  }
  lVar11 = (long)(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      if (0 < local_420.data[lVar11 + -2]) {
        pIVar15 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar11 + -2].idx;
        iVar25 = local_420.data[lVar11 + -2] +
                 (pIVar15->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend(&(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar15,iVar25);
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [(this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thekey[lVar11 + -2].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = iVar25;
      }
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  iVar25 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  lVar11 = (long)iVar25;
  if (iVar1 < iVar25) {
    local_408 = &(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp;
    local_3e8 = *(double *)(in_FS_OFFSET + -8);
    local_3f8 = SUB84(local_3e8,0);
    uStack_3e0 = 0;
    uStack_3f4 = (uint)((ulong)local_3e8 >> 0x20) ^ 0x80000000;
    uStack_3f0 = 0;
    uStack_3ec = 0x80000000;
    do {
      lVar14 = lVar11 + -1;
      lVar11 = lVar11 + -1;
      pIVar15 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar14].idx;
      uVar10 = 0;
      if (scale) {
        uVar10 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar15,local_408);
        pcVar23 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.up.m_backend.prec_elem = 0x1c;
        local_3d8.up.m_backend.data._M_elems[0] = 0;
        local_3d8.up.m_backend.data._M_elems[1] = 0;
        local_3d8.up.m_backend.data._M_elems[2] = 0;
        local_3d8.up.m_backend.data._M_elems[3] = 0;
        local_3d8.up.m_backend.data._M_elems[4] = 0;
        local_3d8.up.m_backend.data._M_elems[5] = 0;
        local_3d8.up.m_backend.data._M_elems[6] = 0;
        local_3d8.up.m_backend.data._M_elems[7] = 0;
        local_3d8.up.m_backend.data._M_elems[8] = 0;
        local_3d8.up.m_backend.data._M_elems[9] = 0;
        local_3d8.up.m_backend.data._M_elems[10] = 0;
        local_3d8.up.m_backend.data._M_elems[0xb] = 0;
        local_3d8.up.m_backend.data._M_elems[0xc] = 0;
        local_3d8.up.m_backend.data._M_elems[0xd] = 0;
        local_3d8.up.m_backend.data._M_elems[0xe] = 0;
        local_3d8.up.m_backend.data._M_elems[0xf] = 0;
        local_3d8.up.m_backend.data._M_elems[0x10] = 0;
        local_3d8.up.m_backend.data._M_elems[0x11] = 0;
        local_3d8.up.m_backend.data._M_elems[0x12] = 0;
        local_3d8.up.m_backend.data._M_elems[0x13] = 0;
        local_3d8.up.m_backend.data._M_elems[0x14] = 0;
        local_3d8.up.m_backend.data._M_elems[0x15] = 0;
        local_3d8.up.m_backend.data._M_elems[0x16] = 0;
        local_3d8.up.m_backend.data._M_elems[0x17] = 0;
        local_3d8.up.m_backend.data._M_elems[0x18] = 0;
        local_3d8.up.m_backend.data._M_elems[0x19] = 0;
        local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.up.m_backend.exp = 0;
        local_3d8.up.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,local_3e8);
        if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
            (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8), iVar25 < 0))
        {
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar16 = pnVar4 + lVar11;
          psVar19 = local_b0;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(undefined4 *)psVar19 = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
            psVar19 = psVar19 + (ulong)bVar26 * -8 + 4;
          }
          local_40 = pnVar4[lVar11].m_backend.exp;
          local_3c = pnVar4[lVar11].m_backend.neg;
          local_38._0_4_ = pnVar4[lVar11].m_backend.fpclass;
          local_38._4_4_ = pnVar4[lVar11].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_3d8,local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)uVar10,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar17 = &local_3d8;
          pnVar16 = pnVar4 + lVar11;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = (pLVar17->up).m_backend.data._M_elems[0];
            pLVar17 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pLVar17 + (ulong)bVar26 * -8 + 4);
            pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pnVar4[lVar11].m_backend.exp = local_3d8.up.m_backend.exp;
          pnVar4[lVar11].m_backend.neg = local_3d8.up.m_backend.neg;
          pnVar4[lVar11].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
          pnVar4[lVar11].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        }
        pcVar23 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.up.m_backend.prec_elem = 0x1c;
        local_3d8.up.m_backend.data._M_elems[0] = 0;
        local_3d8.up.m_backend.data._M_elems[1] = 0;
        local_3d8.up.m_backend.data._M_elems[2] = 0;
        local_3d8.up.m_backend.data._M_elems[3] = 0;
        local_3d8.up.m_backend.data._M_elems[4] = 0;
        local_3d8.up.m_backend.data._M_elems[5] = 0;
        local_3d8.up.m_backend.data._M_elems[6] = 0;
        local_3d8.up.m_backend.data._M_elems[7] = 0;
        local_3d8.up.m_backend.data._M_elems[8] = 0;
        local_3d8.up.m_backend.data._M_elems[9] = 0;
        local_3d8.up.m_backend.data._M_elems[10] = 0;
        local_3d8.up.m_backend.data._M_elems[0xb] = 0;
        local_3d8.up.m_backend.data._M_elems[0xc] = 0;
        local_3d8.up.m_backend.data._M_elems[0xd] = 0;
        local_3d8.up.m_backend.data._M_elems[0xe] = 0;
        local_3d8.up.m_backend.data._M_elems[0xf] = 0;
        local_3d8.up.m_backend.data._M_elems[0x10] = 0;
        local_3d8.up.m_backend.data._M_elems[0x11] = 0;
        local_3d8.up.m_backend.data._M_elems[0x12] = 0;
        local_3d8.up.m_backend.data._M_elems[0x13] = 0;
        local_3d8.up.m_backend.data._M_elems[0x14] = 0;
        local_3d8.up.m_backend.data._M_elems[0x15] = 0;
        local_3d8.up.m_backend.data._M_elems[0x16] = 0;
        local_3d8.up.m_backend.data._M_elems[0x17] = 0;
        local_3d8.up.m_backend.data._M_elems[0x18] = 0;
        local_3d8.up.m_backend.data._M_elems[0x19] = 0;
        local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.up.m_backend.exp = 0;
        local_3d8.up.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)CONCAT44(uStack_3f4,local_3f8)
                  );
        if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
            (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8), 0 < iVar25))
        {
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar16 = pnVar4 + lVar11;
          psVar19 = local_130;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(undefined4 *)psVar19 = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
            psVar19 = psVar19 + (ulong)bVar26 * -8 + 4;
          }
          local_c0 = pnVar4[lVar11].m_backend.exp;
          local_bc = pnVar4[lVar11].m_backend.neg;
          local_b8._0_4_ = pnVar4[lVar11].m_backend.fpclass;
          local_b8._4_4_ = pnVar4[lVar11].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_3d8,local_130,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)uVar10,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar17 = &local_3d8;
          pnVar16 = pnVar4 + lVar11;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = (pLVar17->up).m_backend.data._M_elems[0];
            pLVar17 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pLVar17 + (ulong)bVar26 * -8 + 4);
            pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pnVar4[lVar11].m_backend.exp = local_3d8.up.m_backend.exp;
          pnVar4[lVar11].m_backend.neg = local_3d8.up.m_backend.neg;
          pnVar4[lVar11].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
          pnVar4[lVar11].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        }
        pnVar4 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar4 + lVar11;
        psVar19 = local_1b0;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined4 *)psVar19 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
          psVar19 = psVar19 + (ulong)bVar26 * -8 + 4;
        }
        local_140 = pnVar4[lVar11].m_backend.exp;
        local_13c = pnVar4[lVar11].m_backend.neg;
        local_138._0_4_ = pnVar4[lVar11].m_backend.fpclass;
        local_138._4_4_ = pnVar4[lVar11].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar10,CONCAT31((int3)((uint)local_140 >> 8),local_13c));
        pnVar4 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar17 = &local_3d8;
        pnVar16 = pnVar4 + lVar11;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pLVar17->up).m_backend.data._M_elems[0];
          pLVar17 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar17 + (ulong)bVar26 * -8 + 4);
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        pnVar4[lVar11].m_backend.exp = local_3d8.up.m_backend.exp;
        pnVar4[lVar11].m_backend.neg = local_3d8.up.m_backend.neg;
        pnVar4[lVar11].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
        pnVar4[lVar11].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).scaleExp.data[lVar11] = uVar10;
      }
      lVar14 = (long)(pIVar15->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar14) {
        lVar22 = lVar14 + 1;
        lVar14 = lVar14 * 0x84;
        do {
          iVar25 = *(int *)((long)(((pIVar15->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val).m_backend.data._M_elems + lVar14 + -4);
          pIVar5 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar3 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[iVar25].idx;
          lVar12 = (long)pIVar5[iVar3].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused - (long)local_420.data[iVar25];
          local_420.data[iVar25] = local_420.data[iVar25] + -1;
          pIVar5[iVar3].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .m_elem[lVar12].idx = (int)lVar11;
          if (scale) {
            pNVar6 = (pIVar15->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            puVar18 = (undefined4 *)((long)pNVar6[-1].val.m_backend.data._M_elems + lVar14);
            psVar19 = local_230;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *(undefined4 *)psVar19 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
              psVar19 = psVar19 + (ulong)bVar26 * -8 + 4;
            }
            local_1c0 = *(undefined4 *)
                         ((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x14);
            local_1bc = *(undefined1 *)
                         ((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x10);
            local_1b8 = *(undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0xc)
            ;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_230,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)((this->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).scaleExp.data[iVar25] + uVar10),
                       CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
            pNVar6 = (pIVar15->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pLVar17 = &local_3d8;
            puVar20 = (uint *)((long)pNVar6[-1].val.m_backend.data._M_elems + lVar14);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar20 = (pLVar17->up).m_backend.data._M_elems[0];
              pLVar17 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar17 + (ulong)bVar26 * -8 + 4);
              puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
            }
            *(int *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x14) =
                 local_3d8.up.m_backend.exp;
            *(bool *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x10) =
                 local_3d8.up.m_backend.neg;
            *(undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0xc) =
                 local_3d8.up.m_backend._120_8_;
          }
          pNVar6 = (pIVar15->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar7 = pIVar5[iVar3].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar18 = (undefined4 *)((long)pNVar6[-1].val.m_backend.data._M_elems + lVar14);
          pNVar21 = pNVar7 + lVar12;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pNVar21->val).m_backend.data._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
            pNVar21 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar21 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pNVar7[lVar12].val.m_backend.exp =
               *(int *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x14);
          pNVar7[lVar12].val.m_backend.neg =
               *(bool *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0x10);
          uVar8 = *(undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar14 + -0xc);
          pNVar7[lVar12].val.m_backend.fpclass = (int)uVar8;
          pNVar7[lVar12].val.m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
          lVar22 = lVar22 + -1;
          lVar14 = lVar14 + -0x84;
        } while (1 < lVar22);
      }
    } while (iVar1 < lVar11);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar1));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar2));
  if (local_420.data != (int *)0x0) {
    free(local_420.data);
  }
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }